

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_decompress1X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  byte bVar1;
  ushort uVar2;
  size_t sVar3;
  undefined1 *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  BIT_DStream_t bitD;
  
  uVar2 = *(ushort *)((long)DTable + 2);
  sVar3 = BIT_initDStream(&bitD,cSrc,cSrcSize);
  if (0xffffffffffffff88 < sVar3) {
    return sVar3;
  }
  puVar4 = (undefined1 *)((~((long)dstSize >> 0x3f) & dstSize) + (long)dst);
  if ((long)dstSize < 4) {
    if (bitD.bitsConsumed < 0x41) {
      if (bitD.ptr < bitD.limitPtr) {
        if (bitD.ptr == bitD.start) goto LAB_003d6b46;
        uVar5 = (int)bitD.ptr - (int)bitD.start;
        if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
          uVar5 = bitD.bitsConsumed >> 3;
        }
        bitD.bitsConsumed = bitD.bitsConsumed + uVar5 * -8;
      }
      else {
        uVar5 = bitD.bitsConsumed >> 3;
        bitD.bitsConsumed = bitD.bitsConsumed & 7;
      }
      bitD.ptr = bitD.ptr + -(ulong)uVar5;
      bitD.bitContainer = *(BitContainerType *)bitD.ptr;
      goto LAB_003d6b46;
    }
  }
  else {
    uVar5 = -(uint)uVar2 & 0x3f;
    while (bitD.bitsConsumed < 0x41) {
      if (bitD.ptr < bitD.limitPtr) {
        if (bitD.ptr == bitD.start) goto LAB_003d6b46;
        bVar8 = bitD.start <= (char *)((long)bitD.ptr - (ulong)(bitD.bitsConsumed >> 3));
        uVar6 = (int)bitD.ptr - (int)bitD.start;
        if (bVar8) {
          uVar6 = bitD.bitsConsumed >> 3;
        }
        bitD.bitsConsumed = bitD.bitsConsumed + uVar6 * -8;
      }
      else {
        uVar6 = bitD.bitsConsumed >> 3;
        bitD.bitsConsumed = bitD.bitsConsumed & 7;
        bVar8 = true;
      }
      bitD.ptr = (char *)((long)bitD.ptr - (ulong)uVar6);
      bitD.bitContainer = *(BitContainerType *)bitD.ptr;
      if ((puVar4 + -3 <= dst) || (!bVar8)) goto LAB_003d6b46;
      uVar7 = (bitD.bitContainer << ((ulong)bitD.bitsConsumed & 0x3f)) >> uVar5;
      uVar6 = *(byte *)((long)DTable + uVar7 * 2 + 4) + bitD.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar5;
      uVar6 = *(byte *)((long)DTable + uVar7 * 2 + 4) + uVar6;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar5;
      uVar6 = *(byte *)((long)DTable + uVar7 * 2 + 4) + uVar6;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      uVar7 = (bitD.bitContainer << ((ulong)uVar6 & 0x3f)) >> uVar5;
      bVar1 = *(byte *)((long)DTable + uVar7 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
      dst = (void *)((long)dst + 4);
      bitD.bitsConsumed = bVar1 + uVar6;
    }
  }
  bitD.ptr = "";
LAB_003d6b46:
  for (; dst < puVar4; dst = (void *)((long)dst + 1)) {
    uVar7 = (bitD.bitContainer << ((ulong)bitD.bitsConsumed & 0x3f)) >> (-(uint)uVar2 & 0x3f);
    bitD.bitsConsumed = *(byte *)((long)DTable + uVar7 * 2 + 4) + bitD.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar7 * 2 + 5);
  }
  if (bitD.bitsConsumed != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (bitD.ptr != bitD.start) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif
    if (HUF_ENABLE_FAST_DECODE && !(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}